

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintDistribInternal
               (FILE *pFile,Abc_Ntk_t *pNtk,char *pFanins,char *pFanouts,char *pNode,char *pFanin,
               char *pFanout,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar2 = vFon->nSize;
  if (vFon->nSize < vFan->nSize) {
    uVar2 = vFan->nSize;
  }
  fprintf((FILE *)pFile,"The distribution of %s and %s in the network:\n");
  fprintf((FILE *)pFile,"  Number   %s with %s  %s with %s          Repr1             Repr2\n",pNode
          ,pFanin,pNode,pFanout);
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      uVar6 = 0;
      if ((long)uVar7 < (long)vFan->nSize) {
        uVar6 = vFan->pArray[uVar7];
      }
      uVar5 = 0;
      if ((long)uVar7 < (long)vFon->nSize) {
        uVar5 = (ulong)(uint)vFon->pArray[uVar7];
      }
      iVar4 = (int)uVar5;
      if (uVar6 != 0 || iVar4 != 0) {
        fprintf((FILE *)pFile,"%5d : ",uVar7 & 0xffffffff);
        if (uVar6 == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile,"%12d  ",(ulong)uVar6);
        }
        fwrite("    ",4,1,(FILE *)pFile);
        if (iVar4 == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile,"%12d  ",uVar5);
        }
        fwrite("        ",8,1,(FILE *)pFile);
        if (uVar6 == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          if ((long)vFanR->nSize <= (long)uVar7) goto LAB_002f0427;
          iVar1 = vFanR->pArray[uVar7];
          if (((long)iVar1 < 0) || (pNtk->vObjs->nSize <= iVar1)) goto LAB_002f0408;
          pcVar3 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[iVar1]);
          fprintf((FILE *)pFile,"%12s  ",pcVar3);
        }
        fwrite("    ",4,1,(FILE *)pFile);
        if (iVar4 == 0) {
          fwrite("              ",0xe,1,(FILE *)pFile);
        }
        else {
          if ((long)vFonR->nSize <= (long)uVar7) {
LAB_002f0427:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar4 = vFonR->pArray[uVar7];
          if (((long)iVar4 < 0) || (pNtk->vObjs->nSize <= iVar4)) {
LAB_002f0408:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar3 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[iVar4]);
          fprintf((FILE *)pFile,"%12s  ",pcVar3);
        }
        fputc(10,(FILE *)pFile);
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  return;
}

Assistant:

void Abc_NtkPrintDistribInternal( FILE * pFile, Abc_Ntk_t * pNtk, char * pFanins, char * pFanouts, char * pNode, char * pFanin, char * pFanout, 
                                 Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    int k, nSizeMax = Abc_MaxInt( Vec_IntSize(vFan), Vec_IntSize(vFon) );
    fprintf( pFile, "The distribution of %s and %s in the network:\n", pFanins, pFanouts );
    fprintf( pFile, "  Number   %s with %s  %s with %s          Repr1             Repr2\n", pNode, pFanin, pNode, pFanout );
    for ( k = 0; k < nSizeMax; k++ )
    {
        int EntryFan = k < Vec_IntSize(vFan) ? Vec_IntEntry(vFan, k) : 0;
        int EntryFon = k < Vec_IntSize(vFon) ? Vec_IntEntry(vFon, k) : 0;
        if ( EntryFan == 0 && EntryFon == 0 )
            continue;

        fprintf( pFile, "%5d : ", k );
        if ( EntryFan == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", EntryFan );
        fprintf( pFile, "    " );
        if ( EntryFon == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", EntryFon );

        fprintf( pFile, "        " );
        if ( EntryFan == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12s  ", Abc_ObjName(Abc_NtkObj(pNtk, Vec_IntEntry(vFanR, k))) );
        fprintf( pFile, "    " );
        if ( EntryFon == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12s  ", Abc_ObjName(Abc_NtkObj(pNtk, Vec_IntEntry(vFonR, k))) );
        fprintf( pFile, "\n" );
    }
}